

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

void __thiscall Reducer::visitModule(Reducer *this,Module *curr)

{
  Module *pMVar1;
  pointer puVar2;
  long *plVar3;
  Expression *parent;
  Expression *pEVar4;
  undefined8 uVar5;
  pointer pEVar6;
  bool bVar7;
  int iVar8;
  Index IVar9;
  ostream *poVar10;
  long lVar11;
  undefined8 *puVar12;
  Expression **ppEVar13;
  Type TVar14;
  ulong uVar15;
  undefined1 auVar16 [8];
  long lVar17;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  pointer puVar18;
  Name NVar19;
  Name NVar20;
  Iterator IVar21;
  Signature SVar22;
  HeapType local_f0;
  undefined1 auStack_e8 [8];
  vector<wasm::Export,_std::allocator<wasm::Export>_> exports;
  undefined1 auStack_c8 [8];
  ProgramResult result;
  undefined1 auStack_88 [8];
  Export exp_2;
  undefined1 auStack_58 [8];
  vector<wasm::Export,_std::allocator<wasm::Export>_> currExports;
  ulong local_38;
  
  if ((this->module)._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
      _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl != curr) {
    __assert_fail("curr == module.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp"
                  ,0x3a9,"void Reducer::visitModule(Module *)");
  }
  do {
    bVar7 = reduceFunctions(this);
  } while (bVar7);
  shrinkElementSegments(this);
  poVar10 = std::operator<<((ostream *)&std::cerr,"|    try to remove exports (with factor ");
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,this->factor);
  std::operator<<(poVar10,")\n");
  exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_e8 = (undefined1  [8])0x0;
  exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            + 8);
  for (puVar18 = *(pointer *)
                  &(pMVar1->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ; puVar18 != puVar2; puVar18 = puVar18 + 1) {
    std::vector<wasm::Export,_std::allocator<wasm::Export>_>::push_back
              ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)auStack_e8,
               (value_type *)
               (puVar18->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>);
  }
  local_38 = 1;
  for (uVar15 = 0;
      uVar15 < (ulong)(((long)exports.
                              super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)auStack_e8) / 0x28);
      uVar15 = uVar15 + 1) {
    iVar8 = this->factor / 100;
    if (iVar8 < 1000) {
      iVar8 = 999;
    }
    bVar7 = shouldTryToReduce(this,(ulong)(iVar8 + 1));
    if (bVar7) {
      auStack_58 = (undefined1  [8])0x0;
      currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar17 = uVar15 * 0x28;
      exp_2._32_8_ = uVar15;
      for (; ((ulong)(((long)currExports.
                             super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl
                             .super__Vector_impl_data._M_start - (long)auStack_58) / 0x28) <
              local_38 &&
             (uVar15 < (ulong)(((long)exports.
                                      super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>
                                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_e8)
                              / 0x28))); uVar15 = uVar15 + 1) {
        result.output.field_2._M_allocated_capacity =
             *(size_type *)((long)((long)auStack_e8 + 0x20) + lVar17);
        puVar12 = (undefined8 *)((long)&(((Name *)auStack_e8)->super_IString).str._M_len + lVar17);
        auStack_c8 = (undefined1  [8])*puVar12;
        result._0_8_ = puVar12[1];
        puVar12 = (undefined8 *)
                  ((long)&(((Name *)((long)auStack_e8 + 0x10))->super_IString).str._M_len + lVar17);
        result.output._M_dataplus._M_p = (pointer)*puVar12;
        result.output._M_string_length = puVar12[1];
        NVar19.super_IString.str._M_str = (char *)auStack_c8;
        NVar19.super_IString.str._M_len =
             (size_t)(this->module)._M_t.
                     super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                     super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
        lVar11 = wasm::Module::getExportOrNull(NVar19);
        if (lVar11 != 0) {
          std::vector<wasm::Export,_std::allocator<wasm::Export>_>::push_back
                    ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)auStack_58,
                     (value_type *)auStack_c8);
          NVar20.super_IString.str._M_str = (char *)auStack_c8;
          NVar20.super_IString.str._M_len =
               (size_t)(this->module)._M_t.
                       super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                       super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
          wasm::Module::removeExport(NVar20);
        }
        lVar17 = lVar17 + 0x28;
      }
      result._0_8_ = &result.output._M_string_length;
      result.output._M_dataplus._M_p = (pointer)0x0;
      result.output._M_string_length = result.output._M_string_length & 0xffffffffffffff00;
      bVar7 = writeAndTestReduction(this,(ProgramResult *)auStack_c8);
      pEVar6 = currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = exp_2._32_8_;
      auVar16 = auStack_58;
      if (bVar7) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"|      removed ");
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
        std::operator<<(poVar10," exports\n");
        noteReduction(this,((long)currExports.
                                  super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                                  _M_impl.super__Vector_impl_data._M_start - (long)auStack_58) /
                           0x28);
        uVar15 = uVar5 + local_38;
        local_38 = local_38 * 2;
        if ((ulong)(long)this->factor <= local_38) {
          local_38 = (long)this->factor;
        }
      }
      else {
        for (; auVar16 != (undefined1  [8])pEVar6; auVar16 = (undefined1  [8])((long)auVar16 + 0x28)
            ) {
          exp_2.value.super_IString.str._M_str = *(char **)&((pointer)auVar16)->kind;
          auStack_88 = (undefined1  [8])(((pointer)auVar16)->name).super_IString.str._M_len;
          exp_2.name.super_IString.str._M_len =
               (size_t)(((pointer)auVar16)->name).super_IString.str._M_str;
          exp_2.name.super_IString.str._M_str =
               (char *)(((pointer)auVar16)->value).super_IString.str._M_len;
          exp_2.value.super_IString.str._M_len =
               (size_t)(((pointer)auVar16)->value).super_IString.str._M_str;
          pMVar1 = (this->module)._M_t.
                   super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                   super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
          puVar12 = (undefined8 *)operator_new(0x28);
          puVar12[4] = exp_2.value.super_IString.str._M_str;
          puVar12[2] = exp_2.name.super_IString.str._M_str;
          puVar12[3] = exp_2.value.super_IString.str._M_len;
          *puVar12 = auStack_88;
          puVar12[1] = exp_2.name.super_IString.str._M_len;
          wasm::Module::addExport((Export *)pMVar1);
        }
        bVar7 = local_38 < 2;
        uVar15 = exp_2._32_8_;
        local_38 = local_38 >> 1;
        if (bVar7) {
          local_38 = 1;
        }
      }
      std::__cxx11::string::~string((string *)&result);
      std::_Vector_base<wasm::Export,_std::allocator<wasm::Export>_>::~_Vector_base
                ((_Vector_base<wasm::Export,_std::allocator<wasm::Export>_> *)auStack_58);
    }
  }
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  bVar7 = std::
          all_of<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>*,std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>>,Reducer::visitModule(wasm::Module*)::_lambda(auto:1&)_1_>
                    (*(undefined8 *)
                      &(pMVar1->elementSegments).
                       super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                       ._M_impl,
                     *(pointer *)
                      ((long)&(pMVar1->elementSegments).
                              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                      + 8),((long)exports.
                                  super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                                  _M_impl.super__Vector_impl_data._M_start - (long)auStack_e8) %
                           0x28);
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  plVar3 = *(long **)&(pMVar1->functions).
                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      ._M_impl;
  if ((((long)*(pointer *)
               ((long)&(pMVar1->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               + 8) - (long)plVar3 == 8) &&
      (bVar7 && *(pointer *)
                 &(pMVar1->exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                == *(pointer *)
                    ((long)&(pMVar1->exports).
                            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                    + 8))) && (lVar17 = *plVar3, *(long *)(lVar17 + 0x20) == 0)) {
    parent = *(Expression **)(lVar17 + 0x60);
    if (((0x31 < (ulong)parent->_id) || ((0x200000000000aU >> ((ulong)parent->_id & 0x3f) & 1) == 0)
        ) || (parent[1].type.id == 0)) {
      auStack_58 = *(undefined1 (*) [8])(lVar17 + 0x38);
      wasm::AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                ((AbstractChildIterator<wasm::ChildIterator> *)auStack_c8,parent);
      exp_2.name.super_IString.str._M_len = exp_2.name.super_IString.str._M_len & 0xffffffff00000000
      ;
      auStack_88 = (undefined1  [8])auStack_c8;
      IVar21 = wasm::AbstractChildIterator<wasm::ChildIterator>::end
                         ((AbstractChildIterator<wasm::ChildIterator> *)auStack_c8);
      IVar9 = 0;
      auVar16 = (undefined1  [8])auStack_c8;
LAB_00124020:
      if ((IVar9 == IVar21.index) && (auVar16 == (undefined1  [8])IVar21.parent)) goto LAB_001240b1;
      ppEVar13 = wasm::AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                           ((Iterator *)auStack_88);
      pEVar4 = *ppEVar13;
      if ((pEVar4->type).id != 1) {
        TVar14.id = wasm::HeapType::getSignature();
        SVar22.results.id = (pEVar4->type).id;
        SVar22.params.id = TVar14.id;
        wasm::HeapType::HeapType(&local_f0,SVar22);
        *(uintptr_t *)(lVar17 + 0x38) = local_f0.id;
        *(Expression **)(lVar17 + 0x60) = pEVar4;
        bVar7 = writeAndTestReduction(this);
        if (bVar7) {
          std::operator<<((ostream *)&std::cerr,"|    altered function result type\n");
          noteReduction(this,1);
LAB_001240b1:
          std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
          ~_Vector_base((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                        ((long)&result.output.field_2 + 8));
          goto LAB_001240bd;
        }
        *(undefined1 (*) [8])(lVar17 + 0x38) = auStack_58;
        *(Expression **)(lVar17 + 0x60) = parent;
      }
      IVar9 = (int)exp_2.name.super_IString.str._M_len + 1;
      exp_2.name.super_IString.str._M_len =
           CONCAT44(exp_2.name.super_IString.str._M_len._4_4_,IVar9);
      auVar16 = auStack_88;
      goto LAB_00124020;
    }
  }
LAB_001240bd:
  std::_Vector_base<wasm::Export,_std::allocator<wasm::Export>_>::~_Vector_base
            ((_Vector_base<wasm::Export,_std::allocator<wasm::Export>_> *)auStack_e8);
  return;
}

Assistant:

void visitModule(Module* curr) {
    // The initial module given to us is our global object. As we continue to
    // process things here, we may replace the module, so we should never again
    // refer to curr.
    assert(curr == module.get());
    curr = nullptr;

    // Reduction of entire functions at a time is very effective, and we do it
    // with exponential growth and backoff, so keep doing it while it works.
    while (reduceFunctions()) {
    }

    shrinkElementSegments();

    // try to remove exports
    std::cerr << "|    try to remove exports (with factor " << factor << ")\n";
    std::vector<Export> exports;
    for (auto& exp : module->exports) {
      exports.push_back(*exp);
    }
    size_t skip = 1;
    for (size_t i = 0; i < exports.size(); i++) {
      if (!shouldTryToReduce(std::max((factor / 100) + 1, 1000))) {
        continue;
      }
      std::vector<Export> currExports;
      for (size_t j = 0; currExports.size() < skip && i + j < exports.size();
           j++) {
        auto exp = exports[i + j];
        if (module->getExportOrNull(exp.name)) {
          currExports.push_back(exp);
          module->removeExport(exp.name);
        }
      }
      ProgramResult result;
      if (!writeAndTestReduction(result)) {
        for (auto exp : currExports) {
          module->addExport(new Export(exp));
        }
        skip = std::max(skip / 2, size_t(1)); // or 1?
      } else {
        std::cerr << "|      removed " << currExports.size() << " exports\n";
        noteReduction(currExports.size());
        i += skip;
        skip = std::min(size_t(factor), 2 * skip);
      }
    }
    // If we are left with a single function that is not exported or used in
    // a table, that is useful as then we can change the return type.
    bool allTablesEmpty =
      std::all_of(module->elementSegments.begin(),
                  module->elementSegments.end(),
                  [&](auto& segment) { return segment->data.empty(); });

    if (module->functions.size() == 1 && module->exports.empty() &&
        allTablesEmpty) {
      auto* func = module->functions[0].get();
      // We can't remove something that might have breaks to it.
      if (!func->imported() && !Properties::isNamedControlFlow(func->body)) {
        auto funcType = func->type;
        auto* funcBody = func->body;
        for (auto* child : ChildIterator(func->body)) {
          if (!(child->type.isConcrete() || child->type == Type::none)) {
            continue; // not something a function can return
          }
          // Try to replace the body with the child, fixing up the function
          // to accept it.
          func->type = Signature(funcType.getSignature().params, child->type);
          func->body = child;
          if (writeAndTestReduction()) {
            // great, we succeeded!
            std::cerr << "|    altered function result type\n";
            noteReduction(1);
            break;
          }
          // Undo.
          func->type = funcType;
          func->body = funcBody;
        }
      }
    }
  }